

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

msocket_adt_error_t msocket_bytearray_grow(msocket_bytearray_t *self,uint32_t u32MinLen)

{
  uint32_t uVar1;
  uint local_20;
  uint32_t u32NewLen;
  uint32_t u32MinLen_local;
  msocket_bytearray_t *self_local;
  
  if (self == (msocket_bytearray_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else if (self->u32AllocLen < u32MinLen) {
    local_20 = self->u32AllocLen;
    uVar1 = u32MinLen;
    if (self->u32GrowSize != 0) {
      for (; uVar1 = local_20, local_20 < u32MinLen; local_20 = self->u32GrowSize + local_20) {
      }
    }
    local_20 = uVar1;
    self_local._7_1_ = msocket_bytearray_realloc(self,local_20);
  }
  else {
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

msocket_adt_error_t msocket_bytearray_grow(msocket_bytearray_t *self, uint32_t u32MinLen){
   if( self != 0 ){
      if (u32MinLen > self->u32AllocLen) {
         uint32_t u32NewLen = self->u32AllocLen;
         if (self->u32GrowSize > 0){
            while(u32NewLen<u32MinLen){
               u32NewLen += self->u32GrowSize;
            }
         }
         else
         {
            u32NewLen = u32MinLen;
         }
         return msocket_bytearray_realloc(self, u32NewLen);
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}